

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Next
          (ConcatenatingInputStream *this,void **data,int *size)

{
  int iVar1;
  undefined4 extraout_var;
  bool bVar2;
  
  bVar2 = 0 < this->stream_count_;
  if (0 < this->stream_count_) {
    do {
      iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[2])(*this->streams_,data,size);
      if ((char)iVar1 != '\0') {
        return bVar2;
      }
      iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
      this->bytes_retired_ = this->bytes_retired_ + CONCAT44(extraout_var,iVar1);
      this->streams_ = this->streams_ + 1;
      iVar1 = this->stream_count_;
      this->stream_count_ = iVar1 + -1;
      bVar2 = 1 < iVar1;
    } while (1 < iVar1);
  }
  return bVar2;
}

Assistant:

bool ConcatenatingInputStream::Next(const void** data, int* size) {
  while (stream_count_ > 0) {
    if (streams_[0]->Next(data, size)) return true;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += streams_[0]->ByteCount();
    ++streams_;
    --stream_count_;
  }

  // No more streams.
  return false;
}